

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

void ptr_ll_add(ptr_ll *ll,void *ptr)

{
  ptr_ll_node *ppVar1;
  ptr_ll_node *newNode;
  void *ptr_local;
  ptr_ll *ll_local;
  
  ppVar1 = (ptr_ll_node *)malloc(0x10);
  ppVar1->ptr = ptr;
  ppVar1->next = (ptr_ll_node *)0x0;
  if (ll->bottom != (ptr_ll_node *)0x0) {
    ll->bottom->next = ppVar1;
  }
  ll->bottom = ppVar1;
  if (ll->top == (ptr_ll_node *)0x0) {
    ll->top = ppVar1;
  }
  return;
}

Assistant:

void ptr_ll_add(struct ptr_ll *ll, void *ptr) {
    struct ptr_ll_node *newNode = malloc(sizeof(struct ptr_ll_node));
    newNode->ptr = ptr;
    newNode->next = NULL;
    if(ll->bottom) ll->bottom->next = newNode;
    ll->bottom = newNode;
    if(!ll->top) ll->top = newNode;
}